

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ExtraLogging.cpp
# Opt level: O2

void __thiscall
RenX_ExtraLoggingPlugin::RenX_OnRaw(RenX_ExtraLoggingPlugin *this,Server *server,string_view raw)

{
  FILE *__s;
  string cPrefix;
  
  if (this->printToConsole == true) {
    if ((this->consolePrefix)._M_string_length != 0) {
      std::__cxx11::string::string((string *)&cPrefix,&this->consolePrefix);
      RenX::processTags((string *)&cPrefix,server,(PlayerInfo *)0x0,(PlayerInfo *)0x0,
                        (BuildingInfo *)0x0);
      fwrite(cPrefix._M_dataplus._M_p,1,cPrefix._M_string_length,_stdout);
      fputc(0x20,_stdout);
      std::__cxx11::string::~string((string *)&cPrefix);
    }
    fwrite(raw._M_str,1,raw._M_len,_stdout);
    fputs("\r\n",_stdout);
  }
  __s = (FILE *)this->file;
  if (__s != (FILE *)0x0) {
    if ((this->filePrefix)._M_string_length != 0) {
      std::__cxx11::string::string((string *)&cPrefix,&this->filePrefix);
      RenX::processTags((string *)&cPrefix,server,(PlayerInfo *)0x0,(PlayerInfo *)0x0,
                        (BuildingInfo *)0x0);
      fwrite(cPrefix._M_dataplus._M_p,1,cPrefix._M_string_length,(FILE *)this->file);
      fputc(0x20,(FILE *)this->file);
      std::__cxx11::string::~string((string *)&cPrefix);
      __s = (FILE *)this->file;
    }
    fwrite(raw._M_str,1,raw._M_len,__s);
    fputs("\r\n",(FILE *)this->file);
    fflush((FILE *)this->file);
  }
  return;
}

Assistant:

void RenX_ExtraLoggingPlugin::RenX_OnRaw(RenX::Server &server, std::string_view raw) {
	if (RenX_ExtraLoggingPlugin::printToConsole) {
		if (!RenX_ExtraLoggingPlugin::consolePrefix.empty()) {
			std::string cPrefix = RenX_ExtraLoggingPlugin::consolePrefix;
			RenX::processTags(cPrefix, &server);
			fwrite(cPrefix.data(), sizeof(char), cPrefix.size(), stdout);
			fputc(' ', stdout);
		}
		fwrite(raw.data(), sizeof(char), raw.size(), stdout);
		fputs("\r\n", stdout);
	}

	if (RenX_ExtraLoggingPlugin::file != nullptr) {
		if (!RenX_ExtraLoggingPlugin::filePrefix.empty()) {
			std::string fPrefix = RenX_ExtraLoggingPlugin::filePrefix;
			RenX::processTags(fPrefix, &server);
			fwrite(fPrefix.data(), sizeof(char), fPrefix.size(), file);
			fputc(' ', RenX_ExtraLoggingPlugin::file);
		}
		fwrite(raw.data(), sizeof(char), raw.size(), file);
		fputs("\r\n", file);
		fflush(RenX_ExtraLoggingPlugin::file);
	}
}